

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isAllowedInModule(SyntaxKind kind)

{
  int in_EDI;
  SyntaxKind in_stack_fffffffffffffff0;
  bool local_1;
  
  if (((((in_EDI == 0xcc) || (in_EDI == 0xde)) || (in_EDI == 0x103)) ||
      ((in_EDI == 0x134 || (in_EDI == 0x16f)))) ||
     ((in_EDI == 0x17c || ((in_EDI - 0x1b3U < 2 || (in_EDI == 0x1d1)))))) {
    local_1 = true;
  }
  else {
    local_1 = isAllowedInGenerate(in_stack_fffffffffffffff0);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isAllowedInModule(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PortDeclaration:
        case SyntaxKind::GenerateRegion:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::SpecparamDeclaration:
        case SyntaxKind::SpecifyBlock:
            return true;
        default:
            return isAllowedInGenerate(kind);
    }
}